

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaPSVIIDCBindingPtr_conflict xmlSchemaIDCNewBinding(xmlSchemaIDCPtr_conflict idcDef)

{
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar1;
  xmlNodePtr node;
  
  pxVar1 = (xmlSchemaPSVIIDCBindingPtr_conflict)(*xmlMalloc)(0x28);
  if (pxVar1 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
    xmlSchemaVErrMemory((xmlSchemaValidCtxtPtr)0x0,"allocating a PSVI IDC binding item",node);
  }
  else {
    pxVar1->next = (xmlSchemaPSVIIDCBindingPtr)0x0;
    pxVar1->definition = (xmlSchemaIDCPtr_conflict)0x0;
    pxVar1->nodeTable = (xmlSchemaPSVIIDCNodePtr *)0x0;
    pxVar1->nbNodes = 0;
    pxVar1->sizeNodes = 0;
    pxVar1->dupls = (xmlSchemaItemListPtr)0x0;
    pxVar1->definition = idcDef;
  }
  return pxVar1;
}

Assistant:

static xmlSchemaPSVIIDCBindingPtr
xmlSchemaIDCNewBinding(xmlSchemaIDCPtr idcDef)
{
    xmlSchemaPSVIIDCBindingPtr ret;

    ret = (xmlSchemaPSVIIDCBindingPtr) xmlMalloc(
	    sizeof(xmlSchemaPSVIIDCBinding));
    if (ret == NULL) {
	xmlSchemaVErrMemory(NULL,
	    "allocating a PSVI IDC binding item", NULL);
	return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaPSVIIDCBinding));
    ret->definition = idcDef;
    return (ret);
}